

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_flats.cpp
# Opt level: O0

void __thiscall GLFlat::DrawSubsectors(GLFlat *this,int pass,bool processlights,bool istrans)

{
  subsector_t *psVar1;
  byte *pbVar2;
  gl_subsectorrendernode *local_58;
  gl_subsectorrendernode *local_48;
  gl_subsectorrendernode *node;
  subsector_t *sub_1;
  int i_1;
  subsector_t *sub;
  int local_20;
  int i;
  int index;
  int dli;
  bool istrans_local;
  bool processlights_local;
  GLFlat *pGStack_10;
  int pass_local;
  GLFlat *this_local;
  
  i = this->dynlightindex;
  index._2_1_ = istrans;
  index._3_1_ = processlights;
  dli = pass;
  pGStack_10 = this;
  FRenderState::Apply(&gl_RenderState);
  if (this->vboindex < 0) {
    for (sub_1._4_4_ = 0; sub_1._4_4_ < this->sector->subsectorcount; sub_1._4_4_ = sub_1._4_4_ + 1)
    {
      psVar1 = this->sector->subsectors[sub_1._4_4_];
      pbVar2 = TArray<unsigned_char,_unsigned_char>::operator[]
                         (&gl_drawinfo->ss_renderflags,((long)psVar1 - (long)subsectors) / 0x60);
      if (((*pbVar2 & this->renderflags) != 0) || ((index._2_1_ & 1) != 0)) {
        if ((index._3_1_ & 1) != 0) {
          SetupSubsectorLights(this,0,psVar1,&i);
        }
        DrawSubsector(this,psVar1);
      }
    }
  }
  else {
    local_20 = this->vboindex;
    for (sub._4_4_ = 0; sub._4_4_ < this->sector->subsectorcount; sub._4_4_ = sub._4_4_ + 1) {
      psVar1 = this->sector->subsectors[sub._4_4_];
      pbVar2 = TArray<unsigned_char,_unsigned_char>::operator[]
                         (&gl_drawinfo->ss_renderflags,((long)psVar1 - (long)subsectors) / 0x60);
      if (((*pbVar2 & this->renderflags) != 0) || ((index._2_1_ & 1) != 0)) {
        if ((index._3_1_ & 1) != 0) {
          SetupSubsectorLights(this,0,psVar1,&i);
        }
        glcycle_t::Clock(&drawcalls);
        (*_ptrc_glDrawArrays)(6,local_20,psVar1->numlines);
        glcycle_t::Unclock(&drawcalls);
        flatvertices = psVar1->numlines + flatvertices;
        flatprimitives = flatprimitives + 1;
      }
      local_20 = psVar1->numlines + local_20;
    }
  }
  if ((this->renderflags & 4) == 0) {
    if ((this->renderflags & 1) == 0) {
      local_58 = FDrawInfo::GetOtherCeilingPlanes(gl_drawinfo,this->sector->sectornum);
    }
    else {
      local_58 = FDrawInfo::GetOtherFloorPlanes(gl_drawinfo,this->sector->sectornum);
    }
    for (local_48 = local_58; local_48 != (gl_subsectorrendernode *)0x0; local_48 = local_48->next)
    {
      if ((index._3_1_ & 1) != 0) {
        SetupSubsectorLights(this,0,local_48->sub,&i);
      }
      DrawSubsector(this,local_48->sub);
    }
  }
  return;
}

Assistant:

void GLFlat::DrawSubsectors(int pass, bool processlights, bool istrans)
{
	int dli = dynlightindex;

	gl_RenderState.Apply();
	if (vboindex >= 0)
	{
		int index = vboindex;
		for (int i=0; i<sector->subsectorcount; i++)
		{
			subsector_t * sub = sector->subsectors[i];
				
			if (gl_drawinfo->ss_renderflags[sub-subsectors]&renderflags || istrans)
			{
				if (processlights) SetupSubsectorLights(GLPASS_ALL, sub, &dli);
				drawcalls.Clock();
				glDrawArrays(GL_TRIANGLE_FAN, index, sub->numlines);
				drawcalls.Unclock();
				flatvertices += sub->numlines;
				flatprimitives++;
			}
			index += sub->numlines;
		}
	}
	else
	{
		// Draw the subsectors belonging to this sector
		// (can this case even happen?)
		for (int i=0; i<sector->subsectorcount; i++)
		{
			subsector_t * sub = sector->subsectors[i];
			if (gl_drawinfo->ss_renderflags[sub-subsectors]&renderflags || istrans)
			{
				if (processlights) SetupSubsectorLights(GLPASS_ALL, sub, &dli);
				DrawSubsector(sub);
			}
		}
	}

	// Draw the subsectors assigned to it due to missing textures
	if (!(renderflags&SSRF_RENDER3DPLANES))
	{
		gl_subsectorrendernode * node = (renderflags&SSRF_RENDERFLOOR)?
			gl_drawinfo->GetOtherFloorPlanes(sector->sectornum) :
			gl_drawinfo->GetOtherCeilingPlanes(sector->sectornum);

		while (node)
		{
			if (processlights) SetupSubsectorLights(GLPASS_ALL, node->sub, &dli);
			DrawSubsector(node->sub);
			node = node->next;
		}
	}
}